

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall ncnn::Layer::~Layer(Layer *this)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Layer_01fa0ac0;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)unaff_retaddr);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 10));
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  return;
}

Assistant:

Layer::~Layer()
{
}